

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall
OptionParser_ShortAndLongFlag_Test::TestBody(OptionParser_ShortAndLongFlag_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_120;
  Message local_118;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  char *args [5];
  NullCallback local_c8;
  undefined1 local_a8 [8];
  OptionParser parser;
  int count;
  OptionParser_ShortAndLongFlag_Test *this_local;
  
  parser.on_error_._M_invoker._4_4_ = 0;
  wabt::OptionParser::OptionParser((OptionParser *)local_a8,"prog","desc");
  args[4] = (char *)((long)&parser.on_error_._M_invoker + 4);
  std::function<void()>::function<OptionParser_ShortAndLongFlag_Test::TestBody()::__0,void>
            ((function<void()> *)&local_c8,(anon_class_8_1_a7c1402f *)(args + 4));
  wabt::OptionParser::AddOption((OptionParser *)local_a8,'f',"flag","help",&local_c8);
  std::function<void_()>::~function(&local_c8);
  memcpy(&gtest_ar.message_,&PTR_anon_var_dwarf_802fa_003f5350,0x28);
  wabt::OptionParser::Parse((OptionParser *)local_a8,5,(char **)&gtest_ar.message_);
  local_10c = 4;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_108,"4","count",&local_10c,
             (int *)((long)&parser.on_error_._M_invoker + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-option-parser.cc"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  wabt::OptionParser::~OptionParser((OptionParser *)local_a8);
  return;
}

Assistant:

TEST(OptionParser, ShortAndLongFlag) {
  int count = 0;
  OptionParser parser("prog", "desc");
  parser.AddOption('f', "flag", "help", [&]() { ++count; });
  const char* args[] = {"prog name", "-f", "--flag", "-f", "--flag"};
  parser.Parse(5, const_cast<char**>(args));
  EXPECT_EQ(4, count);
}